

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-multiple.c
# Opt level: O1

int run_test_pipe_connect_multiple(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_loop_t *puVar2;
  uv_pipe_t *handle;
  int iVar3;
  uv_loop_t *server;
  undefined1 *puVar4;
  uv_stream_t *server_00;
  uv_handle_t *handle_00;
  code *unaff_R12;
  uv_close_cb unaff_R13;
  long lVar5;
  client_t *unaff_R14;
  client_t *handle_01;
  char *unaff_R15;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_e0 [56];
  undefined1 auStack_a8 [24];
  uv_close_cb p_Stack_90;
  client_t *pcStack_88;
  uv__queue *puStack_80;
  undefined8 uStack_70;
  code *pcStack_68;
  uv_read_cb p_Stack_58;
  uv_connect_t *puStack_50;
  uv_loop_t *puStack_48;
  client_t *pcStack_40;
  uv__queue *local_38;
  uv__queue *local_30;
  
  iVar3 = (int)auStack_a8 + 0x70;
  pcStack_40 = (client_t *)0x1ad86e;
  puVar2 = uv_default_loop();
  pcStack_40 = (client_t *)0x1ad882;
  iVar1 = uv_pipe_init(puVar2,&server_handle,0);
  local_30 = (uv__queue *)(long)iVar1;
  local_38 = (uv__queue *)0x0;
  if (local_30 == (uv__queue *)0x0) {
    pcStack_40 = (client_t *)0x1ad8b3;
    iVar1 = uv_pipe_bind(&server_handle,"/tmp/uv-test-sock");
    local_30 = (uv__queue *)(long)iVar1;
    local_38 = (uv__queue *)0x0;
    if (local_30 != (uv__queue *)0x0) goto LAB_001ada2a;
    pcStack_40 = (client_t *)0x1ad8e9;
    iVar1 = uv_listen((uv_stream_t *)&server_handle,0x80,connection_cb);
    local_30 = (uv__queue *)(long)iVar1;
    local_38 = (uv__queue *)0x0;
    if (local_30 != (uv__queue *)0x0) goto LAB_001ada37;
    unaff_R14 = clients;
    unaff_R13 = (uv_close_cb)0xa;
    unaff_R15 = "/tmp/uv-test-sock";
    unaff_R12 = connect_cb;
    local_30 = (uv__queue *)0x0;
    do {
      pcStack_40 = (client_t *)0x1ad92f;
      iVar1 = uv_pipe_init(puVar2,&unaff_R14->pipe_handle,0);
      local_30 = (uv__queue *)(long)iVar1;
      local_38 = (uv__queue *)0x0;
      if (local_30 != (uv__queue *)0x0) {
        pcStack_40 = (client_t *)0x1ada1d;
        run_test_pipe_connect_multiple_cold_4();
        goto LAB_001ada1d;
      }
      pcStack_40 = (client_t *)0x1ad962;
      uv_pipe_connect(&unaff_R14->conn_req,&unaff_R14->pipe_handle,"/tmp/uv-test-sock",connect_cb);
      unaff_R14 = unaff_R14 + 1;
      unaff_R13 = unaff_R13 + -1;
    } while (unaff_R13 != (uv_close_cb)0x0);
    pcStack_40 = (client_t *)0x1ad978;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_30 = (uv__queue *)(long)connection_cb_called;
    local_38 = (uv__queue *)0xa;
    if (local_30 != (uv__queue *)0xa) goto LAB_001ada44;
    local_30 = (uv__queue *)(long)connect_cb_called;
    local_38 = (uv__queue *)0xa;
    if (local_30 != (uv__queue *)0xa) goto LAB_001ada51;
    pcStack_40 = (client_t *)0x1ad9cf;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    pcStack_40 = (client_t *)0x1ad9d9;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_30 = (uv__queue *)0x0;
    pcStack_40 = (client_t *)0x1ad9ea;
    iVar1 = uv_loop_close(puVar2);
    local_38 = (uv__queue *)(long)iVar1;
    if (local_30 == local_38) {
      pcStack_40 = (client_t *)0x1ada00;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_001ada1d:
    pcStack_40 = (client_t *)0x1ada2a;
    run_test_pipe_connect_multiple_cold_1();
LAB_001ada2a:
    pcStack_40 = (client_t *)0x1ada37;
    run_test_pipe_connect_multiple_cold_2();
LAB_001ada37:
    pcStack_40 = (client_t *)0x1ada44;
    run_test_pipe_connect_multiple_cold_3();
LAB_001ada44:
    pcStack_40 = (client_t *)0x1ada51;
    run_test_pipe_connect_multiple_cold_5();
LAB_001ada51:
    pcStack_40 = (client_t *)0x1ada5e;
    run_test_pipe_connect_multiple_cold_6();
  }
  server = (uv_loop_t *)(auStack_a8 + 0x78);
  pcStack_40 = (client_t *)connection_cb;
  run_test_pipe_connect_multiple_cold_7();
  puStack_50 = (uv_connect_t *)(long)iVar3;
  p_Stack_58 = (uv_read_cb)0x0;
  puStack_48 = puVar2;
  pcStack_40 = unaff_R14;
  if (puStack_50 == (uv_connect_t *)0x0) {
    handle_01 = (client_t *)(connections + connection_cb_called);
    pcStack_68 = (code *)0x1adabc;
    iVar1 = uv_pipe_init(*(uv_loop_t **)&server->active_handles,(uv_pipe_t *)handle_01,0);
    puStack_50 = (uv_connect_t *)(long)iVar1;
    p_Stack_58 = (uv_read_cb)0x0;
    puVar2 = server;
    unaff_R14 = handle_01;
    if (puStack_50 != (uv_connect_t *)0x0) goto LAB_001adb42;
    pcStack_68 = (code *)0x1adae3;
    iVar1 = uv_accept((uv_stream_t *)server,(uv_stream_t *)handle_01);
    puStack_50 = (uv_connect_t *)(long)iVar1;
    p_Stack_58 = (uv_read_cb)0x0;
    if (puStack_50 == (uv_connect_t *)0x0) {
      connection_cb_called = connection_cb_called + 1;
      if ((connection_cb_called == 10) && (connect_cb_called == 10)) {
        uv_stop(*(uv_loop_t **)&server->active_handles);
        return extraout_EAX;
      }
      return connection_cb_called;
    }
  }
  else {
    pcStack_68 = (code *)0x1adb42;
    connection_cb_cold_1();
LAB_001adb42:
    pcStack_68 = (code *)0x1adb51;
    connection_cb_cold_2();
  }
  puVar4 = auStack_a8 + 0x58;
  iVar1 = (int)auStack_a8 + 0x50;
  pcStack_68 = connect_cb;
  connection_cb_cold_3();
  pcStack_68 = (code *)(long)iVar1;
  uStack_70._0_4_ = 0;
  uStack_70._4_4_ = 0;
  if (pcStack_68 == (code *)0x0) {
    connect_cb_called = connect_cb_called + 1;
    if ((connect_cb_called == 10) && (connection_cb_called == 10)) {
      uv_stop(*(uv_loop_t **)(*(long *)(puVar4 + 0x50) + 8));
      return extraout_EAX_00;
    }
    return connect_cb_called;
  }
  puStack_80 = (uv__queue *)run_test_pipe_connect_close_multiple;
  connect_cb_cold_1();
  iVar3 = (int)auStack_e0 + 0x30;
  auStack_e0._40_8_ = (uv__queue *)0x1adbd4;
  auStack_a8._8_8_ = puVar2;
  auStack_a8._16_8_ = unaff_R12;
  p_Stack_90 = unaff_R13;
  pcStack_88 = unaff_R14;
  puStack_80 = (uv__queue *)unaff_R15;
  puVar2 = uv_default_loop();
  auStack_e0._40_8_ = (uv__queue *)0x1adbe8;
  iVar1 = uv_pipe_init(puVar2,&server_handle,0);
  auStack_a8._0_8_ = SEXT48(iVar1);
  auStack_e0._48_8_ = (uv_handle_t *)0x0;
  if ((uv_handle_t *)auStack_a8._0_8_ == (uv_handle_t *)0x0) {
    auStack_e0._40_8_ = (uv__queue *)0x1adc19;
    iVar1 = uv_pipe_bind(&server_handle,"/tmp/uv-test-sock");
    auStack_a8._0_8_ = SEXT48(iVar1);
    auStack_e0._48_8_ = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_a8._0_8_ != (uv_handle_t *)0x0) goto LAB_001addb5;
    auStack_e0._40_8_ = (uv__queue *)0x1adc4f;
    iVar1 = uv_listen((uv_stream_t *)&server_handle,0x80,connection_cb2);
    auStack_a8._0_8_ = SEXT48(iVar1);
    auStack_e0._48_8_ = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_a8._0_8_ != (uv_handle_t *)0x0) goto LAB_001addc2;
    unaff_R14 = clients;
    lVar5 = 10;
    auStack_a8._0_8_ = (uv_handle_t *)0x0;
    do {
      auStack_e0._40_8_ = (uv__queue *)0x1adc95;
      iVar1 = uv_pipe_init(puVar2,&unaff_R14->pipe_handle,0);
      auStack_a8._0_8_ = SEXT48(iVar1);
      auStack_e0._48_8_ = (uv_handle_t *)0x0;
      if ((uv_handle_t *)auStack_a8._0_8_ != (uv_handle_t *)0x0) {
        auStack_e0._40_8_ = (uv__queue *)0x1adda8;
        run_test_pipe_connect_close_multiple_cold_4();
        goto LAB_001adda8;
      }
      auStack_e0._40_8_ = (uv__queue *)0x1adcc8;
      uv_pipe_connect(&unaff_R14->conn_req,&unaff_R14->pipe_handle,"/tmp/uv-test-sock",connect_cb2);
      unaff_R14 = unaff_R14 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    lVar5 = 0;
    do {
      auStack_e0._40_8_ = (uv__queue *)0x1adce9;
      uv_close((uv_handle_t *)((long)&clients[0].pipe_handle.data + lVar5),(uv_close_cb)0x0);
      lVar5 = lVar5 + 0x150;
    } while (lVar5 != 0xd20);
    auStack_e0._40_8_ = (uv__queue *)0x1add03;
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_a8._0_8_ = SEXT48(connection_cb_called);
    auStack_e0._48_8_ = (uv_handle_t *)0xa;
    unaff_R14 = (client_t *)0xd20;
    if ((uv_handle_t *)auStack_a8._0_8_ != (uv_handle_t *)0xa) goto LAB_001addcf;
    auStack_a8._0_8_ = SEXT48(connect_cb_called);
    auStack_e0._48_8_ = (uv_handle_t *)0xa;
    if ((uv_handle_t *)auStack_a8._0_8_ != (uv_handle_t *)0xa) goto LAB_001adddc;
    auStack_e0._40_8_ = (uv__queue *)0x1add5a;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    auStack_e0._40_8_ = (uv__queue *)0x1add64;
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_a8._0_8_ = (uv_handle_t *)0x0;
    auStack_e0._40_8_ = (uv__queue *)0x1add75;
    iVar1 = uv_loop_close(puVar2);
    auStack_e0._48_8_ = SEXT48(iVar1);
    if (auStack_a8._0_8_ == auStack_e0._48_8_) {
      auStack_e0._40_8_ = (uv__queue *)0x1add8b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_001adda8:
    auStack_e0._40_8_ = (uv__queue *)0x1addb5;
    run_test_pipe_connect_close_multiple_cold_1();
LAB_001addb5:
    auStack_e0._40_8_ = (uv__queue *)0x1addc2;
    run_test_pipe_connect_close_multiple_cold_2();
LAB_001addc2:
    auStack_e0._40_8_ = (uv__queue *)0x1addcf;
    run_test_pipe_connect_close_multiple_cold_3();
LAB_001addcf:
    auStack_e0._40_8_ = (uv__queue *)0x1adddc;
    run_test_pipe_connect_close_multiple_cold_5();
LAB_001adddc:
    auStack_e0._40_8_ = (uv__queue *)0x1adde9;
    run_test_pipe_connect_close_multiple_cold_6();
  }
  server_00 = (uv_stream_t *)auStack_a8;
  auStack_e0._40_8_ = connection_cb2;
  run_test_pipe_connect_close_multiple_cold_7();
  auStack_e0._24_8_ = SEXT48(iVar3);
  auStack_e0._16_8_ = 0;
  auStack_e0._32_8_ = puVar2;
  auStack_e0._40_8_ = unaff_R14;
  if ((uv_close_cb)auStack_e0._24_8_ == (uv_close_cb)0x0) {
    handle = connections + connection_cb_called;
    auStack_e0._0_8_ = (void *)0x1ade47;
    iVar1 = uv_pipe_init(server_00->loop,handle,0);
    auStack_e0._24_8_ = SEXT48(iVar1);
    auStack_e0._16_8_ = 0;
    if ((uv_close_cb)auStack_e0._24_8_ == (uv_close_cb)0x0) {
      auStack_e0._0_8_ = (void *)0x1ade6e;
      iVar1 = uv_accept(server_00,(uv_stream_t *)handle);
      auStack_e0._24_8_ = SEXT48(iVar1);
      auStack_e0._16_8_ = 0;
      if ((uv_close_cb)auStack_e0._24_8_ == (uv_close_cb)0x0) {
        auStack_e0._0_8_ = (void *)0x1ade94;
        uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
        connection_cb_called = connection_cb_called + 1;
        if ((connection_cb_called == 10) && (connect_cb_called == 10)) {
          uv_close((uv_handle_t *)&server_handle,(uv_close_cb)0x0);
          return extraout_EAX_01;
        }
        return connection_cb_called;
      }
      goto LAB_001adeeb;
    }
  }
  else {
    auStack_e0._0_8_ = (void *)0x1adedc;
    connection_cb2_cold_1();
  }
  auStack_e0._0_8_ = (void *)0x1adeeb;
  connection_cb2_cold_2();
LAB_001adeeb:
  iVar1 = (int)auStack_e0 + 0x10;
  auStack_e0._0_8_ = connect_cb2;
  connection_cb2_cold_3();
  auStack_e0._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_e0._0_8_ != (void *)0xffffffffffffff83) {
    handle_00 = (uv_handle_t *)auStack_e0;
    connect_cb2_cold_1();
    iVar1 = uv_is_closing(handle_00);
    if (iVar1 != 0) {
      return iVar1;
    }
    uv_close(handle_00,(uv_close_cb)0x0);
    return extraout_EAX_03;
  }
  connect_cb_called = connect_cb_called + 1;
  if ((connect_cb_called == 10) && (connection_cb_called == 10)) {
    uv_close((uv_handle_t *)&server_handle,(uv_close_cb)0x0);
    return extraout_EAX_02;
  }
  return connect_cb_called;
}

Assistant:

TEST_IMPL(pipe_connect_multiple) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  int i;
  int r;
  uv_loop_t* loop;

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &server_handle, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&server_handle, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server_handle, 128, connection_cb);
  ASSERT_OK(r);

  for (i = 0; i < NUM_CLIENTS; i++) {
    r = uv_pipe_init(loop, &clients[i].pipe_handle, 0);
    ASSERT_OK(r);
    uv_pipe_connect(&clients[i].conn_req,
                    &clients[i].pipe_handle,
                    TEST_PIPENAME,
                    connect_cb);
  }

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(connection_cb_called, NUM_CLIENTS);
  ASSERT_EQ(connect_cb_called, NUM_CLIENTS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}